

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  char *ptr;
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = (ctx->Tables).Buf.Size;
  if (uVar1 != 0) {
    lVar2 = 100;
    uVar3 = 0;
    do {
      if ((long)(int)uVar1 <= (long)uVar3) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        uVar1 = (ctx->Tables).Buf.Size;
      }
      *(undefined4 *)((long)&((ctx->Tables).Buf.Data)->ID + lVar2) = 0xffffffff;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x1e0;
    } while (uVar3 != uVar1);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}